

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug.cc
# Opt level: O0

optional<unsigned_long> kratos::SSATransformFixVisitor::get_target_scope(Var *var)

{
  bool bVar1;
  vector<std::shared_ptr<kratos::Attribute>,_std::allocator<std::shared_ptr<kratos::Attribute>_>_>
  *this;
  __shared_ptr_access<kratos::Attribute,_(__gnu_cxx::_Lock_policy)2,_false,_false> *this_00;
  element_type *peVar2;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 uVar3;
  optional<unsigned_long> oVar4;
  unsigned_long local_80;
  undefined1 local_78 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> v;
  size_type pos;
  string *value_str;
  shared_ptr<kratos::Attribute> *attr;
  const_iterator __end2;
  const_iterator __begin2;
  vector<std::shared_ptr<kratos::Attribute>,_std::allocator<std::shared_ptr<kratos::Attribute>_>_>
  *__range2;
  vector<std::shared_ptr<kratos::Attribute>,_std::allocator<std::shared_ptr<kratos::Attribute>_>_>
  *attrs;
  Var *var_local;
  bool local_10;
  
  this = IRNode::get_attributes(&var->super_IRNode);
  __end2 = std::
           vector<std::shared_ptr<kratos::Attribute>,_std::allocator<std::shared_ptr<kratos::Attribute>_>_>
           ::begin(this);
  attr = (shared_ptr<kratos::Attribute> *)
         std::
         vector<std::shared_ptr<kratos::Attribute>,_std::allocator<std::shared_ptr<kratos::Attribute>_>_>
         ::end(this);
  do {
    bVar1 = __gnu_cxx::operator!=
                      (&__end2,(__normal_iterator<const_std::shared_ptr<kratos::Attribute>_*,_std::vector<std::shared_ptr<kratos::Attribute>,_std::allocator<std::shared_ptr<kratos::Attribute>_>_>_>
                                *)&attr);
    if (!bVar1) {
      std::optional<unsigned_long>::optional((optional<unsigned_long> *)&var_local);
      uVar3 = extraout_RDX_00;
LAB_00a5d0f8:
      oVar4.super__Optional_base<unsigned_long,_true,_true>._M_payload.
      super__Optional_payload_base<unsigned_long>._9_7_ = (undefined7)((ulong)uVar3 >> 8);
      oVar4.super__Optional_base<unsigned_long,_true,_true>._M_payload.
      super__Optional_payload_base<unsigned_long>._M_engaged = local_10;
      oVar4.super__Optional_base<unsigned_long,_true,_true>._M_payload.
      super__Optional_payload_base<unsigned_long>._M_payload =
           (_Storage<unsigned_long,_true>)var_local;
      return (optional<unsigned_long>)
             oVar4.super__Optional_base<unsigned_long,_true,_true>._M_payload.
             super__Optional_payload_base<unsigned_long>;
    }
    this_00 = (__shared_ptr_access<kratos::Attribute,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
              __gnu_cxx::
              __normal_iterator<const_std::shared_ptr<kratos::Attribute>_*,_std::vector<std::shared_ptr<kratos::Attribute>,_std::allocator<std::shared_ptr<kratos::Attribute>_>_>_>
              ::operator*(&__end2);
    peVar2 = std::__shared_ptr_access<kratos::Attribute,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->(this_00);
    v.field_2._8_8_ = std::__cxx11::string::rfind((char *)&peVar2->value_str,0xb390ba);
    if (v.field_2._8_8_ == 0) {
      std::__cxx11::string::substr((ulong)local_78,(ulong)&peVar2->value_str);
      local_80 = std::__cxx11::stoul((string *)local_78,(size_t *)0x0,10);
      std::optional<unsigned_long>::optional<unsigned_long,_true>
                ((optional<unsigned_long> *)&var_local,&local_80);
      std::__cxx11::string::~string((string *)local_78);
      uVar3 = extraout_RDX;
      goto LAB_00a5d0f8;
    }
    __gnu_cxx::
    __normal_iterator<const_std::shared_ptr<kratos::Attribute>_*,_std::vector<std::shared_ptr<kratos::Attribute>,_std::allocator<std::shared_ptr<kratos::Attribute>_>_>_>
    ::operator++(&__end2);
  } while( true );
}

Assistant:

static std::optional<uint64_t> get_target_scope(const Var *var) {
        auto const &attrs = var->get_attributes();
        for (auto const &attr : attrs) {
            auto const &value_str = attr->value_str;
            auto pos = value_str.rfind("ssa-scope=");
            if (pos == 0) {
                auto v = value_str.substr(10);
                return std::stoul(v);
            }
        }
        return std::nullopt;
    }